

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall MeshLib::List<char>::Append(List<char> *this,char *t)

{
  ListNode<char> *tn;
  
  tn = (ListNode<char> *)operator_new(0x10);
  tn->m_data = t;
  tn->m_next = (ListNode<char> *)0x0;
  append(this,tn);
  return;
}

Assistant:

void List<T>::Append( T * t )
{
	ListNode<T> * h = m_head;

	h = new ListNode<T>(t);
	
	append( h );
	return;

}